

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O3

string * toml::format_error(string *__return_storage_ptr__,string *errkind,error_info *err)

{
  size_type __n;
  pointer ppVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  pointer ppVar5;
  ulong uVar6;
  ulong lnw;
  pointer loc;
  string prev_fname;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  error_info *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (errkind->_M_string_length != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)errkind);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,' ');
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(err->title_)._M_dataplus._M_p,(err->title_)._M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,'\n');
  loc = (err->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (err->locations_).
           super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (loc == ppVar1) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    lnw = 0;
    ppVar5 = loc;
    do {
      uVar4 = (ppVar5->first).last_line_;
      uVar6 = 0;
      if (uVar4 != 0) {
        do {
          uVar6 = uVar6 + 1;
          bVar2 = 9 < uVar4;
          uVar4 = uVar4 / 10;
        } while (bVar2);
      }
      if (lnw < uVar6) {
        lnw = uVar6;
      }
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    local_1d0 = err;
    if (loc != ppVar1) {
      __n = lnw + 1;
      bVar2 = true;
      local_1e8 = __return_storage_ptr__;
      local_1e0 = &__return_storage_ptr__->field_2;
      local_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p;
      do {
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          if (__n == 0) {
            local_208._M_string_length = 0;
            local_208.field_2._M_local_buf[0] = '\0';
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_208,__n,' ');
          }
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          if (color::ansi::detail::color_status()::status == 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[01m",5);
          }
          if ((color::ansi::detail::color_status()::status & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[34m",5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," |",2);
          if (color::ansi::detail::color_status()::status == 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
          }
          if ((color::ansi::detail::color_status()::status & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[01m",5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ...\n",5);
          if (color::ansi::detail::color_status()::status == 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                     local_208.field_2._M_local_buf[0]) + 1);
          }
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          if (__n == 0) {
            local_208._M_string_length = 0;
            local_208.field_2._M_local_buf[0] = '\0';
          }
          else {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_construct(&local_208,__n,' ');
          }
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_208._M_dataplus._M_p,
                              local_208._M_string_length);
          if (color::ansi::detail::color_status()::status == 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[01m",5);
          }
          if ((color::ansi::detail::color_status()::status & 1) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[34m",5);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," |\n",3);
          if (color::ansi::detail::color_status()::status == 1) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[00m",5);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                     local_208.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::stringbuf::str();
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                    local_208._M_dataplus._M_p,local_208._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,
                            CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                     local_208.field_2._M_local_buf[0]) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        detail::format_location_impl((string *)local_1a8,lnw,&local_1c8,&loc->first,&loc->second);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                  (char *)local_1a8._0_8_,local_1a8._8_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(loc->first).file_name_);
        loc = loc + 1;
        bVar2 = false;
        err = local_1d0;
        __return_storage_ptr__ = local_1e8;
      } while (loc != ppVar1);
    }
  }
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(err->suffix_)._M_dataplus._M_p,(err->suffix_)._M_string_length)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string format_error(const std::string& errkind, const error_info& err)
{
    std::string errmsg;
    if( ! errkind.empty())
    {
        errmsg = errkind;
        errmsg += ' ';
    }
    errmsg += err.title();
    errmsg += '\n';

    const auto lnw = [&err]() {
        std::size_t width = 0;
        for(const auto& l : err.locations())
        {
            width = (std::max)(detail::integer_width_base10(l.first.last_line_number()), width);
        }
        return width;
    }();

    bool first = true;
    std::string prev_fname;
    for(const auto& lm : err.locations())
    {
        if( ! first)
        {
            std::ostringstream oss;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |" << color::reset
                << color::bold << " ...\n" << color::reset;
            oss << detail::make_string(lnw + 1, ' ')
                << color::bold << color::blue << " |\n" << color::reset;
            errmsg += oss.str();
        }

        const auto& l = lm.first;
        const auto& m = lm.second;

        errmsg += detail::format_location_impl(lnw, prev_fname, l, m);

        prev_fname = l.file_name();
        first = false;
    }

    errmsg += err.suffix();

    return errmsg;
}